

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CmdParser.cpp
# Opt level: O2

SourceFunctionNode __thiscall CmdLineArgsParser::ParseSourceFunctionIds(CmdLineArgsParser *this)

{
  LPWSTR pWVar1;
  uint uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uStack_20;
  
  pWVar1 = this->pszCurrentArg;
  if (*pWVar1 == L'+') {
    this->pszCurrentArg = pWVar1 + 1;
    uVar4 = 1;
LAB_003460dd:
    uStack_20 = 0xffffffffffffffff;
    uVar3 = uStack_20;
  }
  else {
    if (*pWVar1 == L'*') {
      this->pszCurrentArg = pWVar1 + 1;
      uVar4 = 1;
    }
    else {
      uVar2 = ParseInteger(this);
      uVar4 = (ulong)uVar2;
      pWVar1 = this->pszCurrentArg;
      if (*pWVar1 != L'.') {
        uStack_20 = 1;
        uVar3 = uVar4;
        uVar4 = uStack_20;
        goto LAB_003460e0;
      }
      this->pszCurrentArg = pWVar1 + 1;
      if (pWVar1[1] == L'+') {
        this->pszCurrentArg = pWVar1 + 2;
        goto LAB_003460dd;
      }
      if (pWVar1[1] != L'*') {
        uVar2 = ParseInteger(this);
        uVar3 = (ulong)uVar2;
        goto LAB_003460e0;
      }
      this->pszCurrentArg = pWVar1 + 2;
    }
    uStack_20 = 0xfffffffffffffffe;
    uVar3 = uStack_20;
  }
LAB_003460e0:
  return (SourceFunctionNode)(uVar4 | uVar3 << 0x20);
}

Assistant:

Js::SourceFunctionNode
CmdLineArgsParser::ParseSourceFunctionIds()
{
    uint functionId, sourceId;

    if ('*' == CurChar())
    {
        sourceId = 1;
        functionId = (uint)-2;
        NextChar();
    }
    else if ('+' == CurChar())
    {
        sourceId = 1;
        functionId = (uint)-1;
        NextChar();
    }
    else
    {
        functionId = sourceId = ParseInteger();

        if ('.' == CurChar())
        {
            NextChar();
            if ('*' == CurChar())
            {
                functionId = (uint)-2;
                NextChar();
            }
            else if ('+' == CurChar())
            {
                functionId = (uint)-1;
                NextChar();
            }
            else
            {
                functionId = ParseInteger();
            }
        }
        else
        {
            sourceId = 1;
        }
    }
    return SourceFunctionNode(sourceId, functionId);
}